

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

config * Configlist_add(rule *rp,int dot)

{
  char *pcVar1;
  undefined1 local_68 [8];
  config model;
  config *cfp;
  int dot_local;
  rule *rp_local;
  
  if (currentend != (config **)0x0) {
    local_68 = (undefined1  [8])rp;
    model.rp._0_4_ = dot;
    model.bp = Configtable_find((config *)local_68);
    if (model.bp == (config *)0x0) {
      model.bp = newconfig();
      (model.bp)->rp = rp;
      (model.bp)->dot = dot;
      pcVar1 = SetNew();
      (model.bp)->fws = pcVar1;
      (model.bp)->stp = (state *)0x0;
      (model.bp)->bplp = (plink *)0x0;
      (model.bp)->fplp = (plink *)0x0;
      (model.bp)->next = (config *)0x0;
      (model.bp)->bp = (config *)0x0;
      *currentend = model.bp;
      currentend = &(model.bp)->next;
      Configtable_insert(model.bp);
    }
    return model.bp;
  }
  __assert_fail("currentend!=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                ,0x4bb,"struct config *Configlist_add(struct rule *, int)");
}

Assistant:

struct config *Configlist_add(
  struct rule *rp,    /* The rule */
  int dot             /* Index into the RHS of the rule where the dot goes */
){
  struct config *cfp, model;

  assert( currentend!=0 );
  model.rp = rp;
  model.dot = dot;
  cfp = Configtable_find(&model);
  if( cfp==0 ){
    cfp = newconfig();
    cfp->rp = rp;
    cfp->dot = dot;
    cfp->fws = SetNew();
    cfp->stp = 0;
    cfp->fplp = cfp->bplp = 0;
    cfp->next = 0;
    cfp->bp = 0;
    *currentend = cfp;
    currentend = &cfp->next;
    Configtable_insert(cfp);
  }
  return cfp;
}